

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Vec3 *vectorArray,size_t length)

{
  bool bVar1;
  size_t in_RCX;
  Vector3<float> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RDI;
  UniformBinder binder;
  vector<float,_std::allocator<float>_> contiguous;
  reference local_78;
  UniformBinder *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffb0;
  Shader *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  vector<float,_std::allocator<float>_> local_38;
  
  anon_unknown.dwarf_1afe31::flatten<float>(in_RDX,in_RCX);
  UniformBinder::UniformBinder
            ((UniformBinder *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (in_stack_ffffffffffffffc4 != -1) {
    in_stack_ffffffffffffff90 = (UniformBinder *)sf_glad_glUniform3fvARB;
    bVar1 = std::vector<float,_std::allocator<float>_>::empty(in_RDI);
    if (bVar1) {
      local_78 = (reference)0x0;
    }
    else {
      local_78 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,0);
    }
    (*(code *)in_stack_ffffffffffffff90)(in_stack_ffffffffffffffc4,in_RCX & 0xffffffff,local_78);
  }
  UniformBinder::~UniformBinder(in_stack_ffffffffffffff90);
  std::vector<float,_std::allocator<float>_>::~vector(in_RDI);
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Vec3* vectorArray, std::size_t length)
{
    std::vector<float> contiguous = flatten(vectorArray, length);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniform3fv(binder.location, static_cast<GLsizei>(length), !contiguous.empty() ? &contiguous[0] : NULL));
}